

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O3

void toktlini(errcxdef *errctx,toktldef *toktab,uchar *mem,uint siz)

{
  (toktab->toktlsc).toktnxt = (toktdef *)0x0;
  (toktab->toktlsc).tokterr = (errcxdef *)0x0;
  toktab->toktlptr = (uchar *)0x0;
  toktab->toktlnxt = (uchar *)0x0;
  toktab->toktlcnt = 0;
  toktab->toktlsiz = 0;
  (toktab->toktlsc).toktfadd = toktladd;
  (toktab->toktlsc).toktfsea = toktlsea;
  (toktab->toktlsc).toktfeach = toktleach;
  (toktab->toktlsc).toktfset = toktlset;
  (toktab->toktlsc).tokterr = errctx;
  toktab->toktlptr = mem;
  toktab->toktlnxt = mem;
  toktab->toktlsiz = siz;
  return;
}

Assistant:

void toktlini(errcxdef *errctx, toktldef *toktab, uchar *mem, uint siz)
{
    CLRSTRUCT(*toktab);
    
    /* initialize superclass data */
    toktab->toktlsc.toktfadd = toktladd;           /* set add-symbol method */
    toktab->toktlsc.toktfsea = toktlsea;         /* set search-table method */
    toktab->toktlsc.toktfeach = toktleach;             /* set 'each' method */
    toktab->toktlsc.toktfset = toktlset;             /* set 'update' method */
    toktab->toktlsc.tokterr = errctx;         /* set error handling context */
    
    /* initialize class data */
    toktab->toktlptr = mem;
    toktab->toktlnxt = mem;
    toktab->toktlsiz = siz;
}